

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O0

void __thiscall Transporter::Send(Transporter *this,int cmd,json *document)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 local_40 [8];
  string documentText;
  json *document_local;
  int cmd_local;
  Transporter *this_local;
  
  documentText.field_2._8_8_ = document;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump((string_t *)local_40,document,-1,' ',false,ignore);
  uVar1 = std::__cxx11::string::data();
  uVar2 = std::__cxx11::string::size();
  (*this->_vptr_Transporter[3])(this,(ulong)(uint)cmd,uVar1,uVar2);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Transporter::Send(int cmd, const nlohmann::json document)
{
	std::string documentText = document.dump(-1, ' ', false, nlohmann::detail::error_handler_t::ignore);
	Send(cmd, documentText.data(), documentText.size());
}